

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

cmMakefile * __thiscall cmGlobalGenerator::FindMakefile(cmGlobalGenerator *this,string *start_dir)

{
  __type _Var1;
  char *pcVar2;
  cmMakefile *unaff_R12;
  pointer ppcVar3;
  string sd;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppcVar3 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar3 ==
        (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (cmMakefile *)0x0;
    }
    pcVar2 = cmMakefile::GetCurrentSourceDirectory(*ppcVar3);
    std::__cxx11::string::string((string *)&local_50,pcVar2,&local_51);
    _Var1 = std::operator==(&local_50,start_dir);
    if (_Var1) {
      unaff_R12 = *ppcVar3;
    }
    std::__cxx11::string::~string((string *)&local_50);
    ppcVar3 = ppcVar3 + 1;
  } while (!_Var1);
  return unaff_R12;
}

Assistant:

cmMakefile*
cmGlobalGenerator::FindMakefile(const std::string& start_dir) const
{
  for(std::vector<cmMakefile*>::const_iterator it =
      this->Makefiles.begin(); it != this->Makefiles.end(); ++it)
    {
    std::string sd = (*it)->GetCurrentSourceDirectory();
    if (sd == start_dir)
      {
      return *it;
      }
    }
  return 0;
}